

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

void __thiscall crnd::vector<unsigned_short>::clear(vector<unsigned_short> *this)

{
  if (this->m_p != (unsigned_short *)0x0) {
    crnd_free(this->m_p);
    this->m_p = (unsigned_short *)0x0;
    this->m_size = 0;
    this->m_capacity = 0;
  }
  this->m_alloc_failed = false;
  return;
}

Assistant:

inline void clear()
        {
            if (m_p)
            {
                scalar_type<T>::destruct_array(m_p, m_size);
                crnd_free(m_p);
                m_p = NULL;
                m_size = 0;
                m_capacity = 0;
            }

            m_alloc_failed = false;
        }